

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::BinaryWriter::writeRaw(BinaryWriter *this,void *ptr,size_t size)

{
  shared_ptr<pbrt::SerializedEntity> *psVar1;
  _Elt_pointer psVar2;
  _Elt_pointer psVar3;
  
  psVar2 = (this->serializedEntity).c.
           super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar2 == (this->serializedEntity).c.
                super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    psVar1 = (this->serializedEntity).c.
             super__Deque_base<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
    psVar3 = psVar1 + 0x1f;
    psVar2 = psVar1 + 0x20;
  }
  else {
    psVar3 = psVar2 + -1;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             (psVar3->super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ,(const_iterator)
              ((psVar2[-1].super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish,(uchar *)ptr,(uchar *)(size + (long)ptr));
  return;
}

Assistant:

void writeRaw(const void *ptr, size_t size)
    {
      assert(ptr);
      serializedEntity.top()->insert(serializedEntity.top()->end(),(uint8_t*)ptr,(uint8_t*)ptr + size);
    }